

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

void mp_clear(mp_int *a)

{
  mp_digit *__ptr;
  ulong uVar1;
  ulong uVar2;
  
  __ptr = a->dp;
  if (__ptr != (mp_digit *)0x0) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)a->used;
    if (a->used < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      __ptr[uVar2] = 0;
    }
    free(__ptr);
    a->dp = (mp_digit *)0x0;
    a->used = 0;
    a->alloc = 0;
    a->sign = 0;
  }
  return;
}

Assistant:

void mp_clear (mp_int * a)
{
  int i;

  /* only do anything if a hasn't been freed previously */
  if (a->dp != NULL) {
    /* first zero the digits */
    for (i = 0; i < a->used; i++) {
        a->dp[i] = 0;
    }

    /* free ram */
    XFREE(a->dp);

    /* reset members to make debugging easier */
    a->dp    = NULL;
    a->alloc = a->used = 0;
    a->sign  = MP_ZPOS;
  }
}